

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O3

void OCSBtest(double *x,int N,int f,int mlags,char *method,double *statistics,double *critical)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  double *__ptr_00;
  reg_object prVar3;
  reg_object prVar4;
  void *__ptr_01;
  ulong uVar5;
  char *__s;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  __ptr = malloc((long)mlags * 8);
  __ptr_00 = (double *)malloc((long)mlags * 8);
  uVar8 = (ulong)(uint)mlags;
  if ((0 < mlags) && (iVar2 = strcmp(method,"fixed"), iVar2 != 0)) {
    uVar5 = 1;
    do {
      prVar3 = fitOCSB(x,N,f,(int)uVar5,mlags);
      *(reg_object *)((long)__ptr + uVar5 * 8 + -8) = prVar3;
      iVar2 = strcmp(method,"aic");
      lVar7 = 0x98;
      if ((iVar2 != 0) && (iVar2 = strcmp(method,"AIC"), iVar2 != 0)) {
        iVar2 = strcmp(method,"bic");
        lVar7 = 0xa0;
        if ((iVar2 != 0) && (iVar2 = strcmp(method,"BIC"), iVar2 != 0)) {
          iVar2 = strcmp(method,"aicc");
          lVar7 = 0xa8;
          if ((iVar2 != 0) && (iVar2 = strcmp(method,"AICc"), iVar2 != 0)) {
            __s = "Only three criterions are accepted - aic, bic and aicc ";
            goto LAB_0014c0d0;
          }
        }
      }
      __ptr_00[uVar5 - 1] = *(double *)((long)prVar3->R2 + lVar7 + -0x38);
      uVar5 = uVar5 + 1;
    } while (mlags + 1 != uVar5);
    uVar5 = 0;
LAB_0014c0b5:
    if (NAN(__ptr_00[uVar5])) goto code_r0x0014c0c1;
    dVar9 = *__ptr_00;
    iVar2 = -(uint)NAN(dVar9);
    if (mlags != 1) {
      uVar5 = 1;
      dVar9 = (double)(~-(ulong)(!NAN(dVar9) && !NAN(dVar9)) & 0x7fefffffffffffff |
                      (ulong)dVar9 & -(ulong)(!NAN(dVar9) && !NAN(dVar9)));
      do {
        dVar10 = __ptr_00[uVar5];
        iVar1 = (int)uVar5;
        if (dVar9 <= dVar10) {
          dVar10 = dVar9;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        uVar5 = uVar5 + 1;
        dVar9 = dVar10;
      } while (uVar8 != uVar5);
    }
    prVar3 = *(reg_object *)((long)__ptr + (long)iVar2 * 8);
    iVar2 = iVar2 + -1;
    goto LAB_0014c144;
  }
  prVar3 = (reg_object)0x0;
  iVar2 = mlags;
LAB_0014c144:
  prVar4 = fitOCSB(x,N,f,iVar2,iVar2);
  uVar6 = prVar4->rank;
  if (uVar6 != prVar4->p) {
    if (prVar3 == (reg_object)0x0) {
      __s = "Could not find a solution. Try a different method. ";
      goto LAB_0014c0d0;
    }
    uVar6 = prVar3->p;
    prVar4 = prVar3;
  }
  __ptr_01 = malloc((long)(int)uVar6 * 8);
  if (0 < (int)uVar6) {
    lVar7 = 0;
    do {
      *(double *)((long)__ptr_01 + lVar7) =
           *(double *)((long)&prVar4->beta[0].value + lVar7 * 4) /
           *(double *)((long)&prVar4->beta[0].stdErr + lVar7 * 4);
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar6 << 3 != lVar7);
  }
  if (0 < mlags) {
    uVar5 = 0;
    do {
      free_reg(*(reg_object *)((long)__ptr + uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  dVar9 = log((double)f);
  dVar9 = dVar9 + -0.7656451;
  dVar9 = exp(dVar9 * -0.2850853 + dVar9 * dVar9 * -0.05983644);
  *critical = dVar9 * -0.2937411 + -1.652202;
  *statistics = *(double *)((long)__ptr_01 + (long)prVar4->p * 8 + -8);
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return;
code_r0x0014c0c1:
  uVar5 = uVar5 + 1;
  if (uVar8 == uVar5) goto code_r0x0014c0c9;
  goto LAB_0014c0b5;
code_r0x0014c0c9:
  __s = "All lag values up to \'maxlag\' produced singular matrices. Use different method. ";
LAB_0014c0d0:
  puts(__s);
  exit(-1);
}

Assistant:

void OCSBtest(double *x, int N, int f, int mlags, const char *method,double *statistics,double *critical) {
    int i, bestindex,allnans,maxlag;
    double *tval,*icvals;
    reg_object fit;
    reg_object *list = (reg_object*)malloc(sizeof(reg_object)*mlags);
    reg_object crit_reg = NULL;

    icvals = (double*) malloc(sizeof(double)*mlags);

    maxlag = mlags;
    if (mlags > 0 && strcmp(method,"fixed")) {

        for(i = 1; i <= mlags;++i) {
            list[i-1] = fitOCSB(x,N,f,i,mlags);
            icvals[i-1] = getCVal(list[i-1],method);
            //printf("icvals %g",icvals[i-1]);
        }

        allnans = checkAllNans(icvals,mlags);

        if (allnans == 1) {
            printf("All lag values up to 'maxlag' produced singular matrices. Use different method. \n");
            exit(-1);
        }

        bestindex = getBestIndex(icvals,mlags);
        maxlag = bestindex-1;
        crit_reg = list[bestindex];

    }

    /* if (maxlag <= 0) {
        fit = crit_reg;
    } else {
        fit = fitOCSB(x,N,f,maxlag,maxlag);

        if (fit->rank != fit->p && fit->rank == fit->rank) {
            if (crit_reg == NULL) {
                printf("Could not find a solution. Try a different method. \n");
                exit(-1);
            } else {
                fit = crit_reg;
            }
        }
    } */

    fit = fitOCSB(x,N,f,maxlag,maxlag);

    //printf("\n\n%d\n\n",fit->rank);

    if (fit->rank != fit->p && fit->rank == fit->rank) {
        if (crit_reg == NULL) {
            printf("Could not find a solution. Try a different method. \n");
            exit(-1);
        } else {
            fit = crit_reg;
        }
    }

    tval = (double*) malloc(sizeof(double)*fit->p);

    for(i = 0; i < fit->p; ++i) {
		tval[i] = (fit->beta+i)->value/(fit->beta+i)->stdErr;
	}

    //mdisplay(tval,1,fit->p);

    for(i = 0; i < mlags;++i) {
		free_reg(list[i]);
    }

    *critical = calcOCSBCritVal(f);
    *statistics = tval[fit->p-1];

    free(list);
    free(icvals);
    free(tval);
}